

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O3

void __thiscall Refal2::CScanner::error(CScanner *this,TError error,char c)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *this_00;
  char *pcVar2;
  long lVar3;
  ostringstream errorStream;
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  this_00 = local_1a0;
  std::__cxx11::ostringstream::ostringstream(this_00);
  switch(error) {
  case E_InvalidCharacter:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"invalid character `",0x13);
    local_1e0._M_dataplus._M_p._0_1_ = c;
    this_00 = (ostringstream *)
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0,(char *)&local_1e0,1);
    goto LAB_00130dbf;
  case E_InvalidControlCharacter:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"invalid control character with ASCII code ",0x2a);
    pcVar2 = "`";
    lVar3 = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"`",1);
    this_00 = (ostringstream *)std::ostream::operator<<((ostream *)local_1a0,(int)c);
    break;
  case E_UnexpectedCharacter:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"unexpected character `",0x16);
    local_1e0._M_dataplus._M_p._0_1_ = c;
    this_00 = (ostringstream *)
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0,(char *)&local_1e0,1);
LAB_00130dbf:
    lVar3 = 1;
    pcVar2 = "`";
    break;
  case E_UnclosedMultilineCommentAtTheEndOfFile:
    lVar3 = 0x2d;
    pcVar2 = "unclosed multiline comment at the end of file";
    break;
  case E_UnclosedString:
    lVar3 = 0xf;
    pcVar2 = "unclosed string";
    break;
  case E_UnclosedLabel:
    lVar3 = 0xe;
    pcVar2 = "unclosed label";
    break;
  case E_UnexpectedCharacterInLabel:
    lVar3 = 0x1d;
    pcVar2 = "unexpected character in label";
    break;
  case E_UnclosedNumber:
    lVar3 = 0xf;
    pcVar2 = "unclosed number";
    break;
  case E_UnclosedQualifier:
    lVar3 = 0x12;
    pcVar2 = "unclosed qualifier";
    break;
  case E_UnexpectedCharacterInQualifier:
    lVar3 = 0x21;
    pcVar2 = "unexpected character in qualifier";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                  ,0x8e,"void Refal2::CScanner::error(TError, char)");
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar2,lVar3);
  paVar1 = &local_1e0.field_2;
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  if (c == '\n') {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"");
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&local_1e0,'\x01');
  }
  CError::SetTokenData((CError *)this,this->line,this->position,&local_1e0);
  std::__cxx11::stringbuf::str();
  CErrorsHelper::RaiseError((CErrorsHelper *)this,ES_Error,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  CError::ResetToken((CError *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void CScanner::error( TError error, char c )
{
	std::ostringstream errorStream;
	switch( error ) {
		case E_InvalidCharacter:
			errorStream << "invalid character `" << c << "`";
			break;
		case E_InvalidControlCharacter:
			errorStream << "invalid control character with ASCII code "
				<< "`" << static_cast<int>( c ) << "`";
			break;
		case E_UnexpectedCharacter:
			errorStream << "unexpected character `" << c << "`";
			break;
		case E_UnclosedMultilineCommentAtTheEndOfFile:
			errorStream << "unclosed multiline comment at the end of file";
			break;
		case E_UnclosedString:
			errorStream << "unclosed string";
			break;
		case E_UnclosedLabel:
			errorStream << "unclosed label";
			break;
		case E_UnexpectedCharacterInLabel:
			errorStream << "unexpected character in label";
			break;
		case E_UnclosedNumber:
			errorStream << "unclosed number";
			break;
		case E_UnclosedQualifier:
			errorStream << "unclosed qualifier";
			break;
		case E_UnexpectedCharacterInQualifier:
			errorStream << "unexpected character in qualifier";
			break;
		default:
			assert( false );
			break;
	}
	const std::string wrongText = ( c == '\n' ? "" : std::string( 1, c ) );
	CError::SetTokenData( line, position, wrongText );
	CErrorsHelper::RaiseError( ES_Error, errorStream.str() );
	CError::ResetToken();
}